

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

double __thiscall ON_SurfaceCurvature::GaussianCurvature(ON_SurfaceCurvature *this)

{
  if ((ABS(this->k1) < 1.23432101234321e+308) && (ABS(this->k2) < 1.23432101234321e+308)) {
    return this->k1 * this->k2;
  }
  return ON_DBL_QNAN;
}

Assistant:

double ON_SurfaceCurvature::GaussianCurvature() const
{
  return (ON_IS_VALID(k1) && ON_IS_VALID(k2)) ? (k1 * k2) : ON_DBL_QNAN;
}